

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

upb_StringView upb_strtable_iter_key(upb_strtable_iter *i)

{
  upb_SizePrefixString *puVar1;
  _Bool _Var2;
  upb_StringView uVar3;
  
  _Var2 = upb_strtable_done(i);
  if (!_Var2) {
    puVar1 = (i->t->t).entries[i->index].key.str;
    uVar3.data = puVar1 + 1;
    uVar3.size._0_4_ = puVar1->size;
    uVar3.size._4_4_ = 0;
    return uVar3;
  }
  __assert_fail("!upb_strtable_done(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                ,0x228,"upb_StringView upb_strtable_iter_key(const upb_strtable_iter *)");
}

Assistant:

upb_StringView upb_strtable_iter_key(const upb_strtable_iter* i) {
  UPB_ASSERT(!upb_strtable_done(i));
  return upb_key_strview(str_tabent(i)->key);
}